

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erase
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  int *piVar1;
  uint uVar2;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar3;
  _func_int *p_Var4;
  unsigned_long_long *__n;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  locType *pos;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar10;
  long lVar11;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  unsigned_long_long *puVar12;
  locType *plVar13;
  node *pnVar14;
  ulong uVar15;
  node **ppnVar16;
  void *pvVar17;
  int *pp;
  void *__dest;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  undefined8 uStack_a0;
  unsigned_long_long uStack_98;
  int local_8c;
  locType *local_88;
  undefined1 *local_80;
  unsigned_long_long local_78;
  void *local_70;
  long local_68;
  node *local_60;
  unsigned_long_long *local_58;
  unsigned_long_long *local_50;
  int *local_48;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *local_40;
  node **local_38;
  node *pnVar9;
  
  iVar5 = this->depth;
  lVar8 = (long)iVar5;
  if (lVar8 == 0) {
    return false;
  }
  puVar12 = &uStack_98;
  uVar18 = lVar8 * 8 + 8;
  if (iVar5 < -1) {
    uVar18 = 0xffffffffffffffff;
  }
  uVar20 = lVar8 * 4 + 4;
  if (iVar5 < -1) {
    uVar20 = 0xffffffffffffffff;
  }
  uStack_a0 = 0x10cb2f;
  local_40 = this;
  pos = (locType *)operator_new__(uVar18);
  *pos = 0;
  uStack_a0 = 0x10cb41;
  local_38 = (node **)operator_new__(uVar18);
  uStack_a0 = 0x10cb4d;
  local_48 = (int *)operator_new__(uVar20);
  *pos = local_40->root;
  iVar5 = local_40->depth;
  if (0 < iVar5) {
    lVar8 = 0;
    do {
      uStack_a0 = 0x10cb7f;
      iVar5 = (*(local_40->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(local_40->file,pos + lVar8);
      pnVar9 = (node *)CONCAT44(extraout_var,iVar5);
      local_38[lVar8] = pnVar9;
      uVar19 = pnVar9->sz;
      uVar18 = (ulong)uVar19;
      bVar21 = 0 < (int)uVar19;
      if ((int)uVar19 < 1) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (pnVar9->keyvalue[0] < *key) {
          uVar15 = 0;
          do {
            if (uVar18 - 1 == uVar15) {
              bVar21 = uVar15 + 1 < uVar18;
              uVar20 = (ulong)uVar19;
              goto LAB_0010cbe6;
            }
            uVar20 = uVar15 + 1;
            lVar11 = uVar15 + 1;
            uVar15 = uVar20;
          } while (pnVar9->keyvalue[lVar11] < *key);
          bVar21 = uVar20 < uVar18;
        }
      }
LAB_0010cbe6:
      if (lVar8 < (long)local_40->depth + -1) {
        if (bVar21) {
          uVar20 = (ulong)(((int)uVar20 + 1) - (uint)(*key < pnVar9->keyvalue[uVar20 & 0xffffffff]))
          ;
        }
        (pos + lVar8)[1] = (pnVar9->field_0).val[(int)uVar20];
      }
      local_48[lVar8] = (int)uVar20;
      lVar8 = lVar8 + 1;
      iVar5 = local_40->depth;
    } while (lVar8 < iVar5);
  }
  pp = local_48;
  pnVar9 = local_38[(long)iVar5 + -1];
  iVar6 = (int)uVar20;
  if ((iVar6 == pnVar9->sz) || (*key < pnVar9->keyvalue[iVar6])) {
    uStack_a0 = 0x10cc60;
    operator_delete__(local_38);
    uStack_a0 = 0x10cc69;
    operator_delete__(local_48);
    uStack_a0 = 0x10cc71;
    operator_delete__(pos);
    bVar21 = false;
  }
  else {
    if (1 < iVar5 && iVar6 == 0) {
      plVar13 = pos + (iVar5 - 2);
      lVar8 = (ulong)(iVar5 - 2) + 1;
      do {
        lVar11 = (long)local_48[lVar8 + -1];
        if ((lVar11 != 0) && (local_38[lVar8 + -1]->keyvalue[lVar11 + -1] == pnVar9->keyvalue[0])) {
          local_38[lVar8 + -1]->keyvalue[lVar11 + -1] = pnVar9->keyvalue[1];
          uStack_a0 = 0x10ccdc;
          (*(local_40->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(local_40->file,plVar13);
          break;
        }
        plVar13 = plVar13 + -1;
        lVar11 = lVar8 + -1;
        bVar21 = 0 < lVar8;
        lVar8 = lVar11;
      } while (lVar11 != 0 && bVar21);
    }
    ppnVar16 = local_38;
    this_00 = local_40;
    pnVar9 = local_38[(long)iVar5 + -1];
    iVar10 = pnVar9->sz;
    if (iVar6 + 1 < iVar10) {
      lVar8 = (long)(iVar6 + 1);
      do {
        iVar6 = (int)uVar20;
        pnVar9->keyvalue[iVar6] = pnVar9->keyvalue[lVar8];
        (pnVar9->field_0).val[iVar6] = (pnVar9->field_0).val[lVar8];
        lVar8 = lVar8 + 1;
        pnVar9 = local_38[(long)iVar5 + -1];
        iVar10 = pnVar9->sz;
        uVar20 = (ulong)(iVar6 + 1);
      } while (lVar8 < iVar10);
    }
    pnVar9->sz = iVar10 + -1;
    lVar8 = (long)local_40->depth;
    if (lVar8 == 1) {
      if (iVar10 + -1 == 0) {
        local_40->depth = 0;
        uStack_a0 = 0x10ce04;
        DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        ::release(local_40->file,local_40->root);
        this_00->root = -1;
        puVar12 = &uStack_98;
        ppnVar16 = local_38;
      }
      else {
        uStack_a0 = 0x10cd57;
        (*(local_40->file->
          super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          )._vptr_FileManager_Base[3])(local_40->file,&local_40->root);
        puVar12 = &uStack_98;
        ppnVar16 = local_38;
      }
    }
    else if (iVar10 < 0x33) {
      iVar6 = pp[lVar8 + -2];
      pnVar9 = local_38[lVar8 + -2];
      if (iVar6 == pnVar9->sz) {
        local_38[lVar8] = local_38[lVar8 + -1];
        pp[lVar8] = pp[lVar8 + -2];
        pos[lVar8] = pos[lVar8 + -1];
        iVar6 = pnVar9->sz;
        pp[lVar8 + -2] = iVar6 + -1;
        pos[lVar8 + -1] = *(locType *)((long)pnVar9 + (long)iVar6 * 8 + -8);
        uStack_a0 = 0x10cddb;
        iVar6 = (*(local_40->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])(local_40->file,pos + lVar8 + -1);
        local_38[(long)local_40->depth + -1] = (node *)CONCAT44(extraout_var_00,iVar6);
      }
      else {
        pp[lVar8] = iVar6 + 1;
        pos[lVar8] = *(locType *)((long)&local_38[lVar8 + -2]->field_0 + (long)iVar6 * 8 + 8);
        uStack_a0 = 0x10ce36;
        iVar6 = (*(local_40->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])(local_40->file,pos + lVar8);
        local_38[local_40->depth] = (node *)CONCAT44(extraout_var_01,iVar6);
      }
      this_00 = local_40;
      lVar8 = (long)local_40->depth;
      uVar19 = local_38[(long)iVar5 + -1]->sz + local_38[lVar8]->sz;
      if ((int)uVar19 < 100) {
        pnVar9 = local_38[lVar8];
        iVar6 = pnVar9->sz;
        if (0 < iVar6) {
          lVar11 = 0;
          do {
            (local_38[(long)iVar5 + -1]->field_0).val[local_38[(long)iVar5 + -1]->sz + lVar11] =
                 (pnVar9->field_0).val[lVar11];
            local_38[(long)iVar5 + -1]->keyvalue[local_38[(long)iVar5 + -1]->sz + lVar11] =
                 local_38[lVar8]->keyvalue[lVar11];
            lVar11 = lVar11 + 1;
            pnVar9 = local_38[lVar8];
            iVar6 = pnVar9->sz;
          } while (lVar11 < iVar6);
        }
        pnVar14 = local_38[(long)iVar5 + -1];
        pnVar14->nxt = pnVar9->nxt;
        piVar1 = &pnVar14->sz;
        *piVar1 = *piVar1 + iVar6;
        uStack_a0 = 0x10cef4;
        (*(local_40->file->
          super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          )._vptr_FileManager_Base[3])(local_40->file,pos + (long)local_40->depth + -1);
        uStack_a0 = 0x10cf04;
        DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        ::release(this_00->file,pos[this_00->depth]);
        local_8c = this_00->depth + -2;
        uStack_a0 = 0x10cf24;
        erasenonleaf(this_00,&local_8c,local_38,pp,pos);
        ppnVar16 = local_38;
      }
      else {
        local_88 = pos;
        local_80 = (undefined1 *)&uStack_98;
        pvVar17 = (void *)((long)&uStack_98 - ((ulong)uVar19 * 8 + 0x17 & 0xfffffffffffffff0));
        __dest = (void *)((long)pvVar17 - ((ulong)uVar19 * 8 + 0xf & 0xfffffffffffffff0));
        pnVar9 = local_38[lVar8];
        local_78 = pnVar9->keyvalue[0];
        pnVar14 = local_38[(long)iVar5 + -1];
        uVar2 = pnVar14->sz;
        lVar11 = (long)(int)uVar2;
        local_68 = lVar8;
        local_70 = pvVar17;
        if (0 < lVar11) {
          local_58 = pnVar14->keyvalue;
          local_60 = pnVar9;
          local_50 = (unsigned_long_long *)(lVar11 * 8);
          *(undefined8 *)((long)__dest + -8) = 0x10cfd4;
          memcpy(pvVar17,pnVar14,(size_t)(lVar11 * 8));
          __n = local_50;
          puVar12 = local_58;
          *(undefined8 *)((long)__dest + -8) = 0x10cfe4;
          memcpy(__dest,puVar12,(size_t)__n);
          pnVar9 = local_60;
        }
        uVar7 = uVar19 + 1;
        if ((int)uVar2 < (int)uVar19) {
          local_50 = pnVar9->keyvalue;
          pvVar17 = (void *)((long)local_70 + lVar11 * 8);
          local_58 = (unsigned_long_long *)CONCAT44(local_58._4_4_,uVar19 + 1);
          local_60 = pnVar14;
          *(undefined8 *)((long)__dest + -8) = 0x10d02e;
          memcpy(pvVar17,pnVar9,(ulong)(~uVar2 + uVar19) * 8 + 8);
          puVar12 = local_50;
          *(undefined8 *)((long)__dest + -8) = 0x10d050;
          memcpy((void *)(lVar11 * 8 + (long)__dest),puVar12,(ulong)(~uVar2 + uVar19) * 8 + 8);
          pnVar14 = local_60;
          uVar7 = (uint)local_58;
        }
        pos = local_88;
        pnVar14->sz = uVar7 >> 1;
        pnVar9->sz = uVar19 - (uVar7 >> 1);
        pnVar9 = local_38[(long)iVar5 + -1];
        if (0 < pnVar9->sz) {
          lVar8 = 0;
          do {
            (pnVar9->field_0).val[lVar8] = *(long *)((long)local_70 + lVar8 * 8);
            pnVar9 = local_38[(long)iVar5 + -1];
            pnVar9->keyvalue[lVar8] = *(unsigned_long_long *)((long)__dest + lVar8 * 8);
            lVar8 = lVar8 + 1;
          } while (lVar8 < pnVar9->sz);
        }
        pnVar9 = local_38[local_68];
        if (0 < pnVar9->sz) {
          lVar8 = 0;
          do {
            (pnVar9->field_0).val[lVar8] =
                 *(long *)((long)local_70 + (local_38[(long)iVar5 + -1]->sz + lVar8) * 8);
            pnVar9 = local_38[local_68];
            pnVar9->keyvalue[lVar8] =
                 *(unsigned_long_long *)
                  ((long)__dest + (local_38[(long)iVar5 + -1]->sz + lVar8) * 8);
            lVar8 = lVar8 + 1;
          } while (lVar8 < pnVar9->sz);
        }
        pDVar3 = local_40->file;
        plVar13 = local_88 + (long)local_40->depth + -1;
        p_Var4 = (pDVar3->
                 super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                 )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)__dest + -8) = 0x10d120;
        (*p_Var4)(pDVar3,plVar13);
        pDVar3 = local_40->file;
        iVar5 = local_40->depth;
        p_Var4 = (pDVar3->
                 super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                 )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)__dest + -8) = 0x10d139;
        (*p_Var4)(pDVar3,pos + iVar5);
        pp = local_48;
        this_00 = local_40;
        puVar12 = (unsigned_long_long *)local_80;
        ppnVar16 = local_38;
        if (1 < local_40->depth) {
          uVar18 = (ulong)(local_40->depth - 1);
          do {
            uVar19 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar19;
            if (local_38[uVar18]->keyvalue[local_48[uVar18]] == local_78) {
              local_38[uVar18]->keyvalue[local_48[uVar18]] = local_38[local_68]->keyvalue[0];
              pDVar3 = local_40->file;
              p_Var4 = (pDVar3->
                       super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                       )._vptr_FileManager_Base[3];
              *(undefined8 *)((long)__dest + -8) = 0x10d192;
              (*p_Var4)(pDVar3,pos + uVar18);
              this_00 = local_40;
              puVar12 = (unsigned_long_long *)local_80;
              ppnVar16 = local_38;
              break;
            }
          } while (0 < (int)uVar19);
        }
      }
    }
    else {
      uStack_a0 = 0x10cd79;
      (*(local_40->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(local_40->file,pos + lVar8 + -1);
      puVar12 = &uStack_98;
    }
    *(undefined8 *)((long)puVar12 + -8) = 0x10cf2d;
    operator_delete__(ppnVar16);
    *(undefined8 *)((long)puVar12 + -8) = 0x10cf35;
    operator_delete__(pp);
    *(undefined8 *)((long)puVar12 + -8) = 0x10cf3d;
    operator_delete__(pos);
    this_00->siz = this_00->siz + -1;
    bVar21 = true;
  }
  return bVar21;
}

Assistant:

bool erase(const Key &key) {
            if (!depth)return 0;
            int i, j;
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth + 1];
            memset(pos, 0, sizeof pos);
            p = new node *[depth + 1];
            pp = new int[depth + 1];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(key, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j == p[depth - 1]->sz || Compare()(key, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = x->keyvalue[1];
                        file->save(pos[i]);
                        break;
                    }
            }
            //file->release(x->pointer[j]);
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->val[i - 1] = x->val[i];
            --x->sz;
            if (depth == 1) {
                if (!x->sz) {
                    depth = 0;
                    file->release(root);
                    root = -1;
                } else {
                    file->save(root);
                }
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (x->sz >= degree >> 1) {
                file->save(pos[depth - 1]);
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (pp[depth - 2] == p[depth - 2]->sz) {
                p[depth] = p[depth - 1];
                pp[depth] = pp[depth - 2];
                pos[depth] = pos[depth - 1];
                pp[depth - 2] = p[depth - 2]->sz - 1;
                pos[depth - 1] = p[depth - 2]->pointer[pp[depth - 2]];
                p[depth - 1] = file->read(pos[depth - 1]);
            } else {
                pp[depth] = pp[depth - 2] + 1;
                pos[depth] = p[depth - 2]->pointer[pp[depth]];
                p[depth] = file->read(pos[depth]);
            }
            node *&y = p[depth];
            if (x->sz + y->sz < degree) {
                for (i = 0; i < y->sz; ++i)x->val[x->sz + i] = y->val[i], x->keyvalue[x->sz + i] = y->keyvalue[i];
                x->nxt = y->nxt;
                x->sz += y->sz;
                file->save(pos[depth - 1]);
                file->release(pos[depth]);
                erasenonleaf(depth - 2, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz;
                T tmpv[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                for (i = x->sz; i < newsz; ++i)tmpv[i] = y->val[i - x->sz], tmpk[i] = y->keyvalue[i - x->sz];
                x->sz = newsz + 1 >> 1;
                y->sz = newsz - x->sz;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                for (i = 0; i < y->sz; ++i)y->val[i] = tmpv[i + x->sz], y->keyvalue[i] = tmpk[i + x->sz];
                file->save(pos[depth - 1]);
                file->save(pos[depth]);
                for (i = depth - 2; i >= 0; --i)
                    if (equal(old, p[i]->keyvalue[pp[i]])) {
                        p[i]->keyvalue[pp[i]] = y->keyvalue[0];
                        file->save(pos[i]);
                        break;
                    }
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            --siz;
            return 1;
        }